

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigs.c
# Opt level: O2

void print_result(int sock,int rv,cmdCmd_t cmd)

{
  char cVar1;
  ushort **ppuVar2;
  undefined8 uVar3;
  anon_union_4_3_5af155d6_for_cmdCmd_t_3 error;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = cmd._8_8_;
  uVar3 = cmd._0_8_;
  if (8 < (uint)rv) {
    return;
  }
  uVar4 = uVar7 >> 0x20;
  error = cmd.field_3;
  switch(rv) {
  default:
    if (-1 < (long)uVar7) {
      return;
    }
    break;
  case 2:
    printf("%d\n",uVar4,uVar3);
    if (-1 < (long)uVar7) {
      return;
    }
    goto LAB_001035fd;
  case 3:
    pcVar6 = "%08X\n";
    goto LAB_001033ef;
  case 4:
    pcVar6 = "%u\n";
LAB_001033ef:
    printf(pcVar6,uVar4,uVar3);
    return;
  case 5:
    printf("%s",cmdUsage,uVar3);
    return;
  case 6:
    printf("%d",uVar4,uVar3);
    if ((long)uVar7 < 0) {
      pcVar6 = cmdErrStr(error.p3);
      report(0xfd,"ERROR: %s",pcVar6);
    }
    if (error.p3 != 0 && -1 < (long)uVar7) {
      if (printFlags == 2) {
        putchar(0x20);
      }
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        cVar1 = response_buf[uVar7];
        uVar5 = (uint)cVar1;
        if ((printFlags & 1U) == 0) {
          if ((printFlags & 2U) == 0) {
            pcVar6 = " %hhu";
            goto LAB_001034ee;
          }
          ppuVar2 = __ctype_b_loc();
          if (((((*ppuVar2)[(int)uVar5] >> 0xe & 1) == 0) && (cVar1 != '\r')) && (cVar1 != '\n')) {
            pcVar6 = "\\x%02hhx";
            goto LAB_001034ee;
          }
          putchar(uVar5);
        }
        else {
          pcVar6 = " %hhx";
LAB_001034ee:
          printf(pcVar6,(ulong)uVar5);
        }
      }
    }
    goto LAB_0010364e;
  case 7:
    if (error.p3 == 0x2c) {
      lVar8 = 0;
      pcVar6 = "%d";
      do {
        printf(pcVar6,(ulong)*(uint *)(response_buf + lVar8));
        lVar8 = lVar8 + 4;
        pcVar6 = " %d";
      } while (lVar8 != 0x2c);
    }
    else {
      printf("%d",uVar4,uVar3);
      pcVar6 = cmdErrStr(error.p3);
      report(0xfd,"ERROR: %s",pcVar6);
    }
LAB_0010364e:
    putchar(10);
    return;
  case 8:
    if (-1 < (long)uVar7) {
      printf("%d %d",(ulong)(error.p3 - 3),(ulong)(uint)response_buf._0_4_);
      if (4 < (int)error.p3) {
        if (printFlags == 2) {
          putchar(0x20);
        }
        for (uVar7 = 4; uVar7 < uVar4; uVar7 = uVar7 + 1) {
          cVar1 = response_buf[uVar7];
          uVar5 = (uint)cVar1;
          if ((printFlags & 1U) == 0) {
            if ((printFlags & 2U) == 0) {
              pcVar6 = " %hhu";
              goto LAB_001035a8;
            }
            ppuVar2 = __ctype_b_loc();
            if (((((*ppuVar2)[(int)uVar5] >> 0xe & 1) == 0) && (cVar1 != '\r')) && (cVar1 != '\n'))
            {
              pcVar6 = "\\x%02hhx";
              goto LAB_001035a8;
            }
            putchar(uVar5);
          }
          else {
            pcVar6 = " %hhx";
LAB_001035a8:
            printf(pcVar6,(ulong)uVar5);
          }
        }
      }
      goto LAB_0010364e;
    }
  }
  printf("%d\n",uVar4,uVar3);
LAB_001035fd:
  pcVar6 = cmdErrStr(error.p3);
  report(0xfd,"ERROR: %s",pcVar6);
  return;
}

Assistant:

void print_result(int sock, int rv, cmdCmd_t cmd)
{
   int i, r, ch;
   uint32_t *p;

   r = cmd.res;

   switch (rv)
   {
      case 0:
      case 1:
         if (r < 0)
         {
            printf("%d\n", r);
            report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         }
         break;

      case 2:
         printf("%d\n", r);
         if (r < 0) report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         break;

      case 3:
         printf("%08X\n", cmd.res);
         break;

      case 4:
         printf("%u\n", cmd.res);
         break;

      case 5:
         printf("%s", cmdUsage);
         break;

      case 6: /*
                 BI2CZ  CF2  FL  FR  I2CPK  I2CRD  I2CRI  I2CRK
                 I2CZ  SERR  SLR  SPIX  SPIR
              */
         printf("%d", r);
         if (r < 0) report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         if (r > 0)
         {
            if (printFlags == PRINT_ASCII) printf(" ");

            for (i=0; i<r; i++)
            {
               ch = response_buf[i];

               if (printFlags & PRINT_HEX) printf(" %hhx", ch);

               else if (printFlags & PRINT_ASCII)
               {
                  if (isprint(ch) || (ch == '\n') || (ch == '\r'))
                     printf("%c", ch);
                  else printf("\\x%02hhx", ch);
               }
               else printf(" %hhu", response_buf[i]);
            }
         }
         printf("\n");
         break;

      case 7: /* PROCP */
         if (r != (4 + (4*PI_MAX_SCRIPT_PARAMS)))
         {
            printf("%d", r);
            report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
         }
         else
         {
            p = (uint32_t *)response_buf;
            printf("%d", p[0]);
            for (i=0; i<PI_MAX_SCRIPT_PARAMS; i++)
            {
               printf(" %d", p[i+1]);
            }
         }
         printf("\n");
         break;

      case 8: /*
                 BSCX
              */
         if (r < 0)
         {
            printf("%d\n", r);
            report(PIGS_SCRIPT_ERR, "ERROR: %s", cmdErrStr(r));
            break;
         }

         p = (uint32_t *)response_buf;
         printf("%d %d", r-3, p[0]);

         if (r > 4)
         {
            if (printFlags == PRINT_ASCII) printf(" ");

            for (i=4; i<r; i++)
            {
               ch = response_buf[i];

               if (printFlags & PRINT_HEX) printf(" %hhx", ch);

               else if (printFlags & PRINT_ASCII)
               {
                  if (isprint(ch) || (ch == '\n') || (ch == '\r'))
                     printf("%c", ch);
                  else printf("\\x%02hhx", ch);
               }
               else printf(" %hhu", response_buf[i]);
            }
         }
         printf("\n");
         break;

   }
}